

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

msgpack_zone * msgpack_unpacker_release_zone(msgpack_unpacker *mpac)

{
  msgpack_zone *pmVar1;
  _Bool _Var2;
  msgpack_zone *pmVar3;
  
  _Var2 = msgpack_unpacker_flush_zone(mpac);
  if ((_Var2) && (pmVar3 = msgpack_zone_new(0x2000), pmVar3 != (msgpack_zone *)0x0)) {
    pmVar1 = mpac->z;
    mpac->z = pmVar3;
    *(msgpack_zone **)mpac->ctx = pmVar3;
    return pmVar1;
  }
  return (msgpack_zone *)0x0;
}

Assistant:

msgpack_zone* msgpack_unpacker_release_zone(msgpack_unpacker* mpac)
{
    msgpack_zone* r;
    msgpack_zone* old;

    if(!msgpack_unpacker_flush_zone(mpac)) {
        return NULL;
    }

    r = msgpack_zone_new(MSGPACK_ZONE_CHUNK_SIZE);
    if(r == NULL) {
        return NULL;
    }

    old = mpac->z;
    mpac->z = r;
    CTX_CAST(mpac->ctx)->user.z = mpac->z;

    return old;
}